

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_nonce_gen_internal
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *input_nonce,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  secp256k1_context *ctx_00;
  secp256k1_musig_secnonce *secnonce_00;
  int iVar1;
  long lVar2;
  long lVar3;
  secp256k1_scalar *psVar4;
  uchar *r;
  secp256k1_gej *psVar5;
  void *pvVar6;
  secp256k1_sha256 *psVar7;
  secp256k1_ge *psVar8;
  char *pcVar9;
  byte bVar10;
  uchar local_349;
  uint local_348;
  uchar msg_present;
  secp256k1_context *local_340;
  secp256k1_musig_pubnonce *local_338;
  secp256k1_musig_secnonce *local_330;
  uchar rand [32];
  size_t local_300;
  uchar buf [32];
  secp256k1_ge nonce_pts [2];
  uchar pk_ser [33];
  secp256k1_gej nonce_ptj [2];
  secp256k1_scalar k [2];
  secp256k1_ge pk;
  uchar aggpk_ser [32];
  
  bVar10 = 0;
  if (pubnonce == (secp256k1_musig_pubnonce *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar9 = "pubnonce != NULL";
  }
  else {
    local_330 = secnonce;
    memset(pubnonce,0,0x84);
    if (pubkey == (secp256k1_pubkey *)0x0) {
      (*(ctx->illegal_callback).fn)("pubkey != NULL",(ctx->illegal_callback).data);
      return 0;
    }
    if ((ctx->ecmult_gen_ctx).built != 0) {
      local_338 = pubnonce;
      if (seckey == (uchar *)0x0) {
        local_348 = 1;
      }
      else {
        local_348 = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)nonce_ptj,seckey);
        nonce_ptj[0].x.n[0] = 0;
        nonce_ptj[0].x.n[1] = 0;
        nonce_ptj[0].x.n[2] = 0;
        nonce_ptj[0].x.n[3] = 0;
      }
      local_340 = ctx;
      if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
        r = (uchar *)0x0;
      }
      else {
        iVar1 = secp256k1_keyagg_cache_load
                          (ctx,(secp256k1_keyagg_cache_internal *)nonce_ptj,keyagg_cache);
        if (iVar1 == 0) {
          return 0;
        }
        r = aggpk_ser;
        secp256k1_fe_impl_get_b32(r,&nonce_ptj[0].x);
      }
      iVar1 = secp256k1_pubkey_load(local_340,&pk,pubkey);
      if (iVar1 != 0) {
        secp256k1_eckey_pubkey_serialize(&pk,pk_ser,&local_300,1);
        if (seckey == (uchar *)0x0) {
          rand._0_8_ = *(undefined8 *)input_nonce;
          rand._8_8_ = *(undefined8 *)(input_nonce + 8);
          rand._16_8_ = *(undefined8 *)(input_nonce + 0x10);
          rand._24_8_ = *(undefined8 *)(input_nonce + 0x18);
        }
        else {
          nonce_ptj[0].x.n[0] = 0xf463fe7ea19e884b;
          nonce_ptj[0].x.n[1] = 0xbeb0f9ff2f18f9a2;
          nonce_ptj[0].x.n[2] = 0x6ebd26f0f37e8b0;
          nonce_ptj[0].x.n[3] = 0x522fb150e3b243d2;
          nonce_ptj[0].z.n[2] = 0x40;
          secp256k1_sha256_write((secp256k1_sha256 *)nonce_ptj,input_nonce,0x20);
          secp256k1_sha256_finalize((secp256k1_sha256 *)nonce_ptj,rand);
          for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
            rand[lVar2] = rand[lVar2] ^ seckey[lVar2];
          }
          local_349 = ' ';
        }
        nonce_ptj[0].x.n[0] = 0x1800341407101b64;
        nonce_ptj[0].x.n[1] = 0xe6258ee0391bc43;
        nonce_ptj[0].x.n[2] = 0x8343937e29d26b72;
        nonce_ptj[0].x.n[3] = 0xff568a30b7a0a4fb;
        nonce_ptj[0].z.n[2] = 0x40;
        secp256k1_sha256_write((secp256k1_sha256 *)nonce_ptj,rand,0x20);
        secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)nonce_ptj,1,pk_ser,'!');
        secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)nonce_ptj,1,r,' ');
        msg_present = msg32 != (uchar *)0x0;
        secp256k1_sha256_write((secp256k1_sha256 *)nonce_ptj,&msg_present,1);
        if (msg32 != (uchar *)0x0) {
          secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)nonce_ptj,8,msg32,' ');
        }
        secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)nonce_ptj,4,extra_input32,' ');
        psVar4 = k;
        for (lVar2 = 0; secnonce_00 = local_330, local_349 = (uchar)lVar2, lVar2 != 2;
            lVar2 = lVar2 + 1) {
          psVar5 = nonce_ptj;
          psVar7 = (secp256k1_sha256 *)nonce_pts;
          for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
            *(uint64_t *)psVar7->s = (psVar5->x).n[0];
            psVar5 = (secp256k1_gej *)((long)psVar5 + (ulong)bVar10 * -0x10 + 8);
            psVar7 = (secp256k1_sha256 *)((long)psVar7 + (ulong)bVar10 * -0x10 + 8);
          }
          secp256k1_sha256_write((secp256k1_sha256 *)nonce_pts,&local_349,1);
          secp256k1_sha256_finalize((secp256k1_sha256 *)nonce_pts,buf);
          secp256k1_scalar_set_b32(psVar4,buf,(int *)0x0);
          buf[0x10] = '\0';
          buf[0x11] = '\0';
          buf[0x12] = '\0';
          buf[0x13] = '\0';
          buf[0x14] = '\0';
          buf[0x15] = '\0';
          buf[0x16] = '\0';
          buf[0x17] = '\0';
          buf[0x18] = '\0';
          buf[0x19] = '\0';
          buf[0x1a] = '\0';
          buf[0x1b] = '\0';
          buf[0x1c] = '\0';
          buf[0x1d] = '\0';
          buf[0x1e] = '\0';
          buf[0x1f] = '\0';
          buf[0] = '\0';
          buf[1] = '\0';
          buf[2] = '\0';
          buf[3] = '\0';
          buf[4] = '\0';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
          buf[8] = '\0';
          buf[9] = '\0';
          buf[10] = '\0';
          buf[0xb] = '\0';
          buf[0xc] = '\0';
          buf[0xd] = '\0';
          buf[0xe] = '\0';
          buf[0xf] = '\0';
          nonce_pts[0].infinity = 0;
          nonce_pts[0]._84_4_ = 0;
          nonce_pts[1].x.n[0] = 0;
          nonce_pts[0].y.n[3] = 0;
          nonce_pts[0].y.n[4] = 0;
          nonce_pts[0].y.n[1] = 0;
          nonce_pts[0].y.n[2] = 0;
          nonce_pts[0].x.n[4] = 0;
          nonce_pts[0].y.n[0] = 0;
          nonce_pts[0].x.n[2] = 0;
          nonce_pts[0].x.n[3] = 0;
          nonce_pts[1].x.n[1] = 0;
          nonce_pts[0].x.n[0] = 0;
          nonce_pts[0].x.n[1] = 0;
          psVar4 = psVar4 + 1;
        }
        rand[0x10] = '\0';
        rand[0x11] = '\0';
        rand[0x12] = '\0';
        rand[0x13] = '\0';
        rand[0x14] = '\0';
        rand[0x15] = '\0';
        rand[0x16] = '\0';
        rand[0x17] = '\0';
        rand[0x18] = '\0';
        rand[0x19] = '\0';
        rand[0x1a] = '\0';
        rand[0x1b] = '\0';
        rand[0x1c] = '\0';
        rand[0x1d] = '\0';
        rand[0x1e] = '\0';
        rand[0x1f] = '\0';
        rand[0] = '\0';
        rand[1] = '\0';
        rand[2] = '\0';
        rand[3] = '\0';
        rand[4] = '\0';
        rand[5] = '\0';
        rand[6] = '\0';
        rand[7] = '\0';
        rand[8] = '\0';
        rand[9] = '\0';
        rand[10] = '\0';
        rand[0xb] = '\0';
        rand[0xc] = '\0';
        rand[0xd] = '\0';
        rand[0xe] = '\0';
        rand[0xf] = '\0';
        psVar5 = nonce_ptj;
        nonce_ptj[0].z.n[0] = 0;
        nonce_ptj[0].z.n[1] = 0;
        nonce_ptj[0].y.n[3] = 0;
        nonce_ptj[0].y.n[4] = 0;
        nonce_ptj[0].y.n[1] = 0;
        nonce_ptj[0].y.n[2] = 0;
        nonce_ptj[0].x.n[4] = 0;
        nonce_ptj[0].y.n[0] = 0;
        nonce_ptj[0].x.n[2] = 0;
        nonce_ptj[0].x.n[3] = 0;
        nonce_ptj[0].z.n[2] = 0;
        nonce_ptj[0].x.n[0] = 0;
        nonce_ptj[0].x.n[1] = 0;
        local_330->data[0] = '\"';
        local_330->data[1] = '\x0e';
        local_330->data[2] = 0xdc;
        local_330->data[3] = 0xf1;
        psVar4 = k;
        secp256k1_scalar_get_b32(local_330->data + 4,psVar4);
        secp256k1_scalar_get_b32(secnonce_00->data + 0x24,k + 1);
        secp256k1_ge_to_bytes(secnonce_00->data + 0x44,&pk);
        ctx_00 = local_340;
        secp256k1_musig_secnonce_invalidate(local_340,secnonce_00,local_348 ^ 1);
        for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 0x80) {
          secp256k1_ecmult_gen
                    (&ctx_00->ecmult_gen_ctx,(secp256k1_gej *)((long)nonce_ptj[0].x.n + lVar2),
                     psVar4);
          psVar4->d[2] = 0;
          psVar4->d[3] = 0;
          psVar4->d[0] = 0;
          psVar4->d[1] = 0;
          psVar4 = psVar4 + 1;
        }
        psVar8 = nonce_pts + 1;
        nonce_pts[0].x.n[0] = nonce_ptj[0].z.n[0];
        nonce_pts[0].x.n[1] = nonce_ptj[0].z.n[1];
        nonce_pts[0].x.n[2] = nonce_ptj[0].z.n[2];
        nonce_pts[0].x.n[3] = nonce_ptj[0].z.n[3];
        nonce_pts[0].x.n[4] = nonce_ptj[0].z.n[4];
        secp256k1_fe_impl_mul(&psVar8->x,&nonce_pts[0].x,&nonce_ptj[1].z);
        secp256k1_fe_impl_inv((secp256k1_fe *)rand,&psVar8->x);
        secp256k1_fe_impl_mul(&psVar8->x,&nonce_pts[0].x,(secp256k1_fe *)rand);
        secp256k1_fe_impl_mul((secp256k1_fe *)rand,(secp256k1_fe *)rand,&nonce_ptj[1].z);
        nonce_pts[0].x.n[2]._0_1_ = rand[0x10];
        nonce_pts[0].x.n[2]._1_1_ = rand[0x11];
        nonce_pts[0].x.n[2]._2_1_ = rand[0x12];
        nonce_pts[0].x.n[2]._3_1_ = rand[0x13];
        nonce_pts[0].x.n[2]._4_1_ = rand[0x14];
        nonce_pts[0].x.n[2]._5_1_ = rand[0x15];
        nonce_pts[0].x.n[2]._6_1_ = rand[0x16];
        nonce_pts[0].x.n[2]._7_1_ = rand[0x17];
        nonce_pts[0].x.n[3]._0_1_ = rand[0x18];
        nonce_pts[0].x.n[3]._1_1_ = rand[0x19];
        nonce_pts[0].x.n[3]._2_1_ = rand[0x1a];
        nonce_pts[0].x.n[3]._3_1_ = rand[0x1b];
        nonce_pts[0].x.n[3]._4_1_ = rand[0x1c];
        nonce_pts[0].x.n[3]._5_1_ = rand[0x1d];
        nonce_pts[0].x.n[3]._6_1_ = rand[0x1e];
        nonce_pts[0].x.n[3]._7_1_ = rand[0x1f];
        nonce_pts[0].x.n[0]._0_1_ = rand[0];
        nonce_pts[0].x.n[0]._1_1_ = rand[1];
        nonce_pts[0].x.n[0]._2_1_ = rand[2];
        nonce_pts[0].x.n[0]._3_1_ = rand[3];
        nonce_pts[0].x.n[0]._4_1_ = rand[4];
        nonce_pts[0].x.n[0]._5_1_ = rand[5];
        nonce_pts[0].x.n[0]._6_1_ = rand[6];
        nonce_pts[0].x.n[0]._7_1_ = rand[7];
        nonce_pts[0].x.n[1]._0_1_ = rand[8];
        nonce_pts[0].x.n[1]._1_1_ = rand[9];
        nonce_pts[0].x.n[1]._2_1_ = rand[10];
        nonce_pts[0].x.n[1]._3_1_ = rand[0xb];
        nonce_pts[0].x.n[1]._4_1_ = rand[0xc];
        nonce_pts[0].x.n[1]._5_1_ = rand[0xd];
        nonce_pts[0].x.n[1]._6_1_ = rand[0xe];
        nonce_pts[0].x.n[1]._7_1_ = rand[0xf];
        for (lVar2 = 0; lVar2 != 0xb0; lVar2 = lVar2 + 0x58) {
          psVar8 = (secp256k1_ge *)((long)nonce_pts[0].x.n + lVar2);
          secp256k1_ge_set_gej_zinv(psVar8,psVar5,(secp256k1_fe *)psVar8);
          psVar5 = psVar5 + 1;
        }
        for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 0x80) {
          *(undefined8 *)((long)nonce_ptj[0].z.n + lVar2 + 0x20) = 0;
          *(undefined8 *)((long)(&nonce_ptj[0].z + 1) + lVar2) = 0;
          *(undefined8 *)((long)nonce_ptj[0].z.n + lVar2 + 0x10) = 0;
          *(undefined8 *)((long)nonce_ptj[0].z.n + lVar2 + 0x18) = 0;
          *(undefined8 *)((long)nonce_ptj[0].z.n + lVar2) = 0;
          *(undefined8 *)((long)nonce_ptj[0].z.n + lVar2 + 8) = 0;
          *(undefined8 *)((long)nonce_ptj[0].y.n + lVar2 + 0x18) = 0;
          *(undefined8 *)((long)nonce_ptj[0].y.n + lVar2 + 0x20) = 0;
          *(undefined8 *)((long)nonce_ptj[0].y.n + lVar2 + 8) = 0;
          *(undefined8 *)((long)nonce_ptj[0].y.n + lVar2 + 0x10) = 0;
          *(undefined8 *)((long)nonce_ptj[0].x.n + lVar2 + 0x20) = 0;
          *(undefined8 *)((long)nonce_ptj[0].y.n + lVar2) = 0;
          *(undefined8 *)((long)nonce_ptj[0].x.n + lVar2 + 0x10) = 0;
          *(undefined8 *)((long)nonce_ptj[0].x.n + lVar2 + 0x18) = 0;
          *(undefined8 *)((long)nonce_ptj[0].x.n + lVar2) = 0;
          *(undefined8 *)((long)nonce_ptj[0].x.n + lVar2 + 8) = 0;
        }
        for (lVar2 = 0; lVar2 != 0xb0; lVar2 = lVar2 + 0x58) {
          secp256k1_declassify(ctx_00,(void *)((long)nonce_pts[0].x.n + lVar2),0x58);
        }
        secp256k1_musig_pubnonce_save(local_338,nonce_pts);
        return local_348;
      }
      return 0;
    }
    pvVar6 = (ctx->illegal_callback).data;
    pcVar9 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  (*(ctx->illegal_callback).fn)(pcVar9,pvVar6);
  return 0;
}

Assistant:

static int secp256k1_musig_nonce_gen_internal(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, const unsigned char *input_nonce, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    secp256k1_scalar k[2];
    secp256k1_ge nonce_pts[2];
    secp256k1_gej nonce_ptj[2];
    int i;
    unsigned char pk_ser[33];
    size_t pk_ser_len = sizeof(pk_ser);
    unsigned char aggpk_ser[32];
    unsigned char *aggpk_ser_ptr = NULL;
    secp256k1_ge pk;
    int pk_serialize_success;
    int ret = 1;

    ARG_CHECK(pubnonce != NULL);
    memset(pubnonce, 0, sizeof(*pubnonce));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));

    /* Check that the seckey is valid to be able to sign for it later. */
    if (seckey != NULL) {
        secp256k1_scalar sk;
        ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey);
        secp256k1_scalar_clear(&sk);
    }

    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i;
        if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
            return 0;
        }
        /* The loaded point cache_i.pk can not be the point at infinity. */
        secp256k1_fe_get_b32(aggpk_ser, &cache_i.pk.x);
        aggpk_ser_ptr = aggpk_ser;
    }
    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    pk_serialize_success = secp256k1_eckey_pubkey_serialize(&pk, pk_ser, &pk_ser_len, 1);

#ifdef VERIFY
    /* A pubkey cannot be the point at infinity */
    VERIFY_CHECK(pk_serialize_success);
    VERIFY_CHECK(pk_ser_len == sizeof(pk_ser));
#else
    (void) pk_serialize_success;
#endif

    secp256k1_nonce_function_musig(k, input_nonce, msg32, seckey, pk_ser, aggpk_ser_ptr, extra_input32);
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[0]));
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[1]));
    secp256k1_musig_secnonce_save(secnonce, k, &pk);
    secp256k1_musig_secnonce_invalidate(ctx, secnonce, !ret);

    /* Compute pubnonce as two gejs */
    for (i = 0; i < 2; i++) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_ptj[i], &k[i]);
        secp256k1_scalar_clear(&k[i]);
    }

    /* Batch convert to two public ges */
    secp256k1_ge_set_all_gej(nonce_pts, nonce_ptj, 2);
    for (i = 0; i < 2; i++) {
        secp256k1_gej_clear(&nonce_ptj[i]);
    }

    for (i = 0; i < 2; i++) {
        secp256k1_declassify(ctx, &nonce_pts[i], sizeof(nonce_pts[i]));
    }
    /* None of the nonce_pts will be infinity because k != 0 with overwhelming
     * probability */
    secp256k1_musig_pubnonce_save(pubnonce, nonce_pts);
    return ret;
}